

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::LifetimeTests::details::FboInputAttacher::drawContainer
          (FboInputAttacher *this,GLuint fbo,Surface *dst)

{
  Context *ctx;
  TestLog *this_00;
  MessageBuilder *pMVar1;
  ContextWrapper *this_01;
  double __x;
  MessageBuilder local_1a0;
  Surface *local_20;
  Surface *dst_local;
  FboInputAttacher *pFStack_10;
  GLuint fbo_local;
  FboInputAttacher *this_local;
  
  this_01 = &(this->super_InputAttacher).super_ContextWrapper;
  local_20 = dst;
  dst_local._4_4_ = fbo;
  pFStack_10 = this;
  ctx = ContextWrapper::getContext(this_01);
  drawFbo(ctx,dst_local._4_4_,local_20);
  ContextWrapper::log(this_01,__x);
  tcu::TestLog::operator<<(&local_1a0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<
                     (&local_1a0,(char (*) [33])"// Read pixels from framebuffer ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(uint *)((long)&dst_local + 4));
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [18])" to output image.");
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  return;
}

Assistant:

void FboInputAttacher::drawContainer (GLuint fbo, Surface& dst)
{
	drawFbo(getContext(), fbo, dst);
	log() << TestLog::Message
		  << "// Read pixels from framebuffer " << fbo << " to output image."
		  << TestLog::EndMessage;
}